

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

char * Assimp::MappingTypeToString(aiTextureMapping in)

{
  char *pcStack_10;
  aiTextureMapping in_local;
  
  switch(in) {
  case aiTextureMapping_UV:
    pcStack_10 = "UV";
    break;
  case aiTextureMapping_SPHERE:
    pcStack_10 = "Sphere";
    break;
  case aiTextureMapping_CYLINDER:
    pcStack_10 = "Cylinder";
    break;
  case aiTextureMapping_BOX:
    pcStack_10 = "Box";
    break;
  case aiTextureMapping_PLANE:
    pcStack_10 = "Plane";
    break;
  case aiTextureMapping_OTHER:
    pcStack_10 = "Other";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                  ,0x126,"const char *Assimp::MappingTypeToString(aiTextureMapping)");
  }
  return pcStack_10;
}

Assistant:

const char* MappingTypeToString(aiTextureMapping in)
{
    switch (in)
    {
    case aiTextureMapping_UV:
        return "UV";
    case aiTextureMapping_BOX:
        return "Box";
    case aiTextureMapping_SPHERE:
        return "Sphere";
    case aiTextureMapping_CYLINDER:
        return "Cylinder";
    case aiTextureMapping_PLANE:
        return "Plane";
    case aiTextureMapping_OTHER:
        return "Other";
    default:
        break;
    }

    ai_assert(false);
    return  "BUG";
}